

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup.cpp
# Opt level: O0

void __thiscall QDnsLookup::QDnsLookup(QDnsLookup *this,Type type,QString *name,QObject *parent)

{
  QObjectPrivate *newValue;
  QObject *in_RCX;
  QDnsLookupPrivate *in_RDI;
  QDnsLookupPrivate *d;
  
  newValue = (QObjectPrivate *)operator_new(0x1b0);
  QDnsLookupPrivate::QDnsLookupPrivate(in_RDI);
  QObject::QObject((QObject *)in_RDI,newValue,in_RCX);
  *(undefined ***)in_RDI = &PTR_metaObject_0049f470;
  d_func((QDnsLookup *)0x33f1a6);
  QObjectBindableProperty<QDnsLookupPrivate,_QString,_&QDnsLookupPrivate::_qt_property_name_offset,_&QDnsLookupPrivate::nameChanged>
  ::operator=((QObjectBindableProperty<QDnsLookupPrivate,_QString,_&QDnsLookupPrivate::_qt_property_name_offset,_&QDnsLookupPrivate::nameChanged>
               *)in_RDI,(parameter_type)newValue);
  QObjectBindableProperty<QDnsLookupPrivate,_QDnsLookup::Type,_&QDnsLookupPrivate::_qt_property_type_offset,_&QDnsLookupPrivate::typeChanged>
  ::operator=((QObjectBindableProperty<QDnsLookupPrivate,_QDnsLookup::Type,_&QDnsLookupPrivate::_qt_property_type_offset,_&QDnsLookupPrivate::typeChanged>
               *)in_RDI,(parameter_type)((ulong)newValue >> 0x20));
  return;
}

Assistant:

QDnsLookup::QDnsLookup(Type type, const QString &name, QObject *parent)
    : QObject(*new QDnsLookupPrivate, parent)
{
    Q_D(QDnsLookup);
    d->name = name;
    d->type = type;
}